

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O3

ON_Xform * __thiscall
ON_Xform::operator+(ON_Xform *__return_storage_ptr__,ON_Xform *this,ON_Xform *rhs)

{
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  double local_28;
  double dStack_20;
  double local_18;
  double dStack_10;
  
  local_88 = rhs->m_xform[0][0] + this->m_xform[0][0];
  dStack_80 = rhs->m_xform[0][1] + this->m_xform[0][1];
  local_78 = rhs->m_xform[0][2] + this->m_xform[0][2];
  dStack_70 = rhs->m_xform[0][3] + this->m_xform[0][3];
  local_68 = rhs->m_xform[1][0] + this->m_xform[1][0];
  dStack_60 = rhs->m_xform[1][1] + this->m_xform[1][1];
  local_58 = rhs->m_xform[1][2] + this->m_xform[1][2];
  dStack_50 = rhs->m_xform[1][3] + this->m_xform[1][3];
  local_48 = rhs->m_xform[2][0] + this->m_xform[2][0];
  dStack_40 = rhs->m_xform[2][1] + this->m_xform[2][1];
  local_38 = rhs->m_xform[2][2] + this->m_xform[2][2];
  dStack_30 = rhs->m_xform[2][3] + this->m_xform[2][3];
  local_28 = rhs->m_xform[3][0] + this->m_xform[3][0];
  dStack_20 = rhs->m_xform[3][1] + this->m_xform[3][1];
  local_18 = rhs->m_xform[3][2] + this->m_xform[3][2];
  dStack_10 = rhs->m_xform[3][3] + this->m_xform[3][3];
  ON_Xform(__return_storage_ptr__,(double (*) [4])&local_88);
  return __return_storage_ptr__;
}

Assistant:

ON_Xform ON_Xform::operator+( const ON_Xform& rhs ) const
{
  double m[4][4];
  const double* p = &rhs.m_xform[0][0];

  m[0][0] = m_xform[0][0] + p[0];
  m[0][1] = m_xform[0][1] + p[1];
  m[0][2] = m_xform[0][2] + p[2];
  m[0][3] = m_xform[0][3] + p[3];

  m[1][0] = m_xform[1][0] + p[4];
  m[1][1] = m_xform[1][1] + p[5];
  m[1][2] = m_xform[1][2] + p[6];
  m[1][3] = m_xform[1][3] + p[7];

  m[2][0] = m_xform[2][0] + p[ 8];
  m[2][1] = m_xform[2][1] + p[ 9];
  m[2][2] = m_xform[2][2] + p[10];
  m[2][3] = m_xform[2][3] + p[11];

  m[3][0] = m_xform[3][0] + p[12];
  m[3][1] = m_xform[3][1] + p[13];
  m[3][2] = m_xform[3][2] + p[14];
  m[3][3] = m_xform[3][3] + p[15];

  return ON_Xform(m);
}